

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O0

void * p2sc_get_symbol(char *path,char **name,void **addr)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  long in_RDX;
  long *in_RSI;
  undefined8 in_RDI;
  GModule *module;
  long *local_10;
  
  iVar1 = g_module_supported();
  if (iVar1 == 0) {
    _p2sc_msg("p2sc_get_symbol",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
              ,0xe6,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",0x12c0,
              "Dynamic loading of modules not supported");
    exit(1);
  }
  pvVar2 = (void *)g_module_open(in_RDI,3);
  local_10 = in_RSI;
  if (pvVar2 != (void *)0x0) {
    do {
      if (*local_10 == 0) {
        return pvVar2;
      }
      in_RDX = in_RDX + 8;
      iVar1 = g_module_symbol(pvVar2,*local_10);
      local_10 = local_10 + 1;
    } while (iVar1 != 0);
    uVar3 = g_module_error();
    _p2sc_msg("p2sc_get_symbol",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
              ,0xf0,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",0x12c0,"%s",uVar3,pvVar2
              ,in_RDX);
    exit(1);
  }
  uVar3 = g_module_error();
  _p2sc_msg("p2sc_get_symbol",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
            ,0xec,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",0x12c0,"%s",uVar3);
  exit(1);
}

Assistant:

void *p2sc_get_symbol(const char *path, const char **name, void **addr) {
    if (!g_module_supported())
        P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "Dynamic loading of modules not supported");

    GModule *module = g_module_open(path,
                                    (GModuleFlags) (G_MODULE_BIND_LAZY | G_MODULE_BIND_LOCAL));

    if (!module)
        P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "%s", g_module_error());

    while (*name)
        if (!g_module_symbol(module, *name++, addr++))
            P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "%s", g_module_error());

    return module;
}